

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O0

Box * __thiscall
amrex::BATindexType::operator()(Box *__return_storage_ptr__,BATindexType *this,Box *bx)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  IndexType *pIVar4;
  int local_9c;
  Box *bx_local;
  BATindexType *this_local;
  int off;
  uint bitval;
  uint typ;
  int dir;
  
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = *(undefined8 *)(bx->smallend).vect;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) =
       *(undefined8 *)((bx->smallend).vect + 2);
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 1) =
       *(undefined8 *)((bx->bigend).vect + 1);
  (__return_storage_ptr__->btype).itype = (bx->btype).itype;
  uVar1 = (this->m_typ).itype;
  for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
    bVar3 = (byte)local_9c;
    uVar2 = (uint)((uVar1 & 1 << (bVar3 & 0x1f)) != 0);
    (__return_storage_ptr__->bigend).vect[local_9c] =
         (uVar2 - (((__return_storage_ptr__->btype).itype & 1 << (bVar3 & 0x1f)) != 0)) +
         (__return_storage_ptr__->bigend).vect[local_9c];
    pIVar4 = &__return_storage_ptr__->btype;
    if (uVar2 == 0) {
      pIVar4->itype = (1 << (bVar3 & 0x1f) ^ 0xffffffffU) & pIVar4->itype;
    }
    else {
      pIVar4->itype = 1 << (bVar3 & 0x1f) | pIVar4->itype;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Box operator() (const Box& bx) const noexcept { return amrex::convert(bx,m_typ); }